

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::IncludeScope::~IncludeScope(IncludeScope *this)

{
  bool bVar1;
  cmListFileBacktrace local_30;
  IncludeScope *local_10;
  IncludeScope *this_local;
  
  local_10 = this;
  if ((this->NoPolicyScope & 1U) == 0) {
    if (((this->CheckCMP0011 & 1U) != 0) &&
       (bVar1 = cmStateSnapshot::HasDefinedPolicyCMP0011(&this->Makefile->StateSnapshot), !bVar1)) {
      this->CheckCMP0011 = false;
    }
    PopPolicy(this->Makefile);
    if ((this->CheckCMP0011 & 1U) != 0) {
      EnforceCMP0011(this);
    }
  }
  PopSnapshot(this->Makefile,(bool)(this->ReportError & 1));
  PopFunctionBlockerBarrier(this->Makefile,(bool)(this->ReportError & 1));
  cmListFileBacktrace::Pop(&local_30,&this->Makefile->Backtrace);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,&local_30);
  cmListFileBacktrace::~cmListFileBacktrace(&local_30);
  return;
}

Assistant:

cmMakefile::IncludeScope::~IncludeScope()
{
  if (!this->NoPolicyScope) {
    // If we need to enforce policy CMP0011 then the top entry is the
    // one we pushed above.  If the entry is empty, then the included
    // script did not set any policies that might affect the includer so
    // we do not need to enforce the policy.
    if (this->CheckCMP0011 &&
        !this->Makefile->StateSnapshot.HasDefinedPolicyCMP0011()) {
      this->CheckCMP0011 = false;
    }

    // Pop the scope we pushed for the script.
    this->Makefile->PopPolicy();

    // We enforce the policy after the script's policy stack entry has
    // been removed.
    if (this->CheckCMP0011) {
      this->EnforceCMP0011();
    }
  }
  this->Makefile->PopSnapshot(this->ReportError);

  this->Makefile->PopFunctionBlockerBarrier(this->ReportError);

  this->Makefile->Backtrace = this->Makefile->Backtrace.Pop();
}